

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void ImportModuleNamespaces(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx)

{
  uint uVar1;
  Allocator *allocator;
  ScopeData *scope;
  NamespaceData *parent_00;
  int iVar2;
  uint uVar3;
  NamespaceData **ppNVar4;
  NamespaceData *this;
  InplaceStr local_108;
  SynIdentifier local_f8;
  NamespaceData *local_a8;
  NamespaceData *ns;
  NamespaceData *pNStack_98;
  uint k_1;
  NamespaceData *parent;
  NamespaceData *pNStack_88;
  uint k;
  NamespaceData *prev;
  uint local_6c;
  ExternNamespaceInfo *pEStack_68;
  uint nameHash;
  ExternNamespaceInfo *namespaceData;
  ExternNamespaceInfo *pEStack_58;
  uint i;
  ExternNamespaceInfo *namespaceList;
  char *symbols;
  ByteCode *bCode;
  TraceScope traceScope;
  ModuleContext *moduleCtx_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  if ((ImportModuleNamespaces(ExpressionContext&,SynBase*,ModuleContext&)::token == '\0') &&
     (iVar2 = __cxa_guard_acquire(&ImportModuleNamespaces(ExpressionContext&,SynBase*,ModuleContext&)
                                   ::token), iVar2 != 0)) {
    ImportModuleNamespaces::token = NULLC::TraceGetToken("analyze","ImportModuleNamespaces");
    __cxa_guard_release(&ImportModuleNamespaces(ExpressionContext&,SynBase*,ModuleContext&)::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&bCode,ImportModuleNamespaces::token);
  symbols = (char *)moduleCtx->data->bytecode;
  namespaceList = (ExternNamespaceInfo *)FindSymbols((ByteCode *)symbols);
  pEStack_58 = FindFirstNamespace((ByteCode *)symbols);
  namespaceData._4_4_ = 0;
  do {
    if (*(uint *)(symbols + 0x84) <= namespaceData._4_4_) {
      NULLC::TraceScope::~TraceScope((TraceScope *)&bCode);
      return;
    }
    pEStack_68 = pEStack_58 + namespaceData._4_4_;
    InplaceStr::InplaceStr
              ((InplaceStr *)&prev,
               (char *)((long)&namespaceList->offsetToName + (ulong)pEStack_68->offsetToName));
    local_6c = InplaceStr::hash((InplaceStr *)&prev);
    pNStack_88 = (NamespaceData *)0x0;
    for (parent._4_4_ = 0; uVar1 = parent._4_4_,
        uVar3 = SmallArray<NamespaceData_*,_128U>::size(&ctx->namespaces), uVar1 < uVar3;
        parent._4_4_ = parent._4_4_ + 1) {
      ppNVar4 = SmallArray<NamespaceData_*,_128U>::operator[](&ctx->namespaces,parent._4_4_);
      if ((*ppNVar4)->nameHash == local_6c) {
        ppNVar4 = SmallArray<NamespaceData_*,_128U>::operator[](&ctx->namespaces,parent._4_4_);
        pNStack_88 = *ppNVar4;
        break;
      }
    }
    pNStack_98 = (NamespaceData *)0x0;
    if (pEStack_68->parentHash != 0xffffffff) {
      for (ns._4_4_ = 0; uVar1 = ns._4_4_,
          uVar3 = SmallArray<NamespaceData_*,_128U>::size(&ctx->namespaces), uVar1 < uVar3;
          ns._4_4_ = ns._4_4_ + 1) {
        ppNVar4 = SmallArray<NamespaceData_*,_128U>::operator[](&ctx->namespaces,ns._4_4_);
        if ((*ppNVar4)->nameHash == pEStack_68->parentHash) {
          ppNVar4 = SmallArray<NamespaceData_*,_128U>::operator[](&ctx->namespaces,ns._4_4_);
          pNStack_98 = *ppNVar4;
          break;
        }
      }
      if (pNStack_98 == (NamespaceData *)0x0) {
        anon_unknown.dwarf_6f1cc::Stop
                  (ctx,source,"ERROR: namespace %s parent not found",
                   (long)&namespaceList->offsetToName + (ulong)pEStack_68->offsetToName);
      }
    }
    if ((pNStack_88 == (NamespaceData *)0x0) || (pNStack_88->parent != pNStack_98)) {
      this = ExpressionContext::get<NamespaceData>(ctx);
      parent_00 = pNStack_98;
      allocator = ctx->allocator;
      scope = ctx->scope;
      InplaceStr::InplaceStr
                (&local_108,
                 (char *)((long)&namespaceList->offsetToName + (ulong)pEStack_68->offsetToName));
      SynIdentifier::SynIdentifier(&local_f8,local_108);
      uVar1 = ctx->uniqueNamespaceId;
      ctx->uniqueNamespaceId = uVar1 + 1;
      NamespaceData::NamespaceData(this,allocator,source,scope,parent_00,&local_f8,uVar1);
      SynIdentifier::~SynIdentifier(&local_f8);
      local_a8 = this;
      if (pNStack_98 == (NamespaceData *)0x0) {
        SmallArray<NamespaceData_*,_2U>::push_back(&ctx->globalNamespaces,&local_a8);
      }
      else {
        SmallArray<NamespaceData_*,_2U>::push_back(&pNStack_98->children,&local_a8);
      }
      SmallArray<NamespaceData_*,_128U>::push_back(&ctx->namespaces,&local_a8);
    }
    namespaceData._4_4_ = namespaceData._4_4_ + 1;
  } while( true );
}

Assistant:

void ImportModuleNamespaces(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx)
{
	TRACE_SCOPE("analyze", "ImportModuleNamespaces");

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	// Import namespaces
	ExternNamespaceInfo *namespaceList = FindFirstNamespace(bCode);

	for(unsigned i = 0; i < bCode->namespaceCount; i++)
	{
		ExternNamespaceInfo &namespaceData = namespaceList[i];

		unsigned nameHash = InplaceStr(symbols + namespaceData.offsetToName).hash();

		NamespaceData *prev = NULL;

		for(unsigned k = 0; k < ctx.namespaces.size(); k++)
		{
			if(ctx.namespaces[k]->nameHash == nameHash)
			{
				prev = ctx.namespaces[k];
				break;
			}
		}

		NamespaceData *parent = NULL;

		if(namespaceData.parentHash != ~0u)
		{
			for(unsigned k = 0; k < ctx.namespaces.size(); k++)
			{
				if(ctx.namespaces[k]->nameHash == namespaceData.parentHash)
				{
					parent = ctx.namespaces[k];
					break;
				}
			}

			if(!parent)
				Stop(ctx, source, "ERROR: namespace %s parent not found", symbols + namespaceData.offsetToName);
		}

		if(prev && prev->parent == parent)
			continue;

		NamespaceData *ns = new (ctx.get<NamespaceData>()) NamespaceData(ctx.allocator, source, ctx.scope, parent, SynIdentifier(InplaceStr(symbols + namespaceData.offsetToName)), ctx.uniqueNamespaceId++);

		if(parent)
			parent->children.push_back(ns);
		else
			ctx.globalNamespaces.push_back(ns);

		ctx.namespaces.push_back(ns);
	}
}